

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  text *unaff_RBP;
  undefined4 in_register_0000003c;
  long *plVar7;
  _Alloc_hider _Var8;
  pointer pbVar9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  text local_110;
  fd_set *local_f0;
  text local_e8;
  text local_c8;
  text local_a8;
  text local_88;
  text local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  plVar7 = (long *)CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,*plVar7,plVar7[1] + *plVar7);
    bVar4 = hidden(&local_68);
    uVar6 = (uint)CONCAT71(extraout_var,bVar4) ^ 1;
    _Var8._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0010a430;
  }
  else {
    bVar4 = false;
    pbVar9 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar10 = (long *)__readfds->fds_bits[1];
    local_f0 = __readfds;
    do {
      plVar2 = plVar10;
      plVar10 = plVar2 + -4;
      plVar1 = (long *)local_f0->fds_bits[0];
      if (plVar2 == plVar1) {
        uVar6 = (uint)pbVar9;
        break;
      }
      iVar5 = std::__cxx11::string::compare((char *)plVar10);
      unaff_RBP = (text *)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      if (iVar5 == 0) {
        bVar3 = false;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)plVar10);
        if (iVar5 != 0) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,*plVar10,plVar2[-3] + *plVar10);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          unaff_RBP = &local_a8;
          std::__cxx11::string::_M_construct<char*>((string *)unaff_RBP,*plVar7,plVar7[1] + *plVar7)
          ;
          bVar3 = search(&local_c8,unaff_RBP);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if (!bVar3) {
            if (*(char *)*plVar10 == '!') {
              std::__cxx11::string::substr((ulong)&local_130,(ulong)plVar10);
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              if (local_130 == &local_120) {
                local_110.field_2._8_4_ = local_120._8_4_;
                local_110.field_2._12_4_ = local_120._12_4_;
              }
              else {
                local_110._M_dataplus._M_p = (pointer)local_130;
              }
              local_110.field_2._M_allocated_capacity._4_4_ = local_120._M_allocated_capacity._4_4_;
              local_110.field_2._M_allocated_capacity._0_4_ = local_120._M_allocated_capacity._0_4_;
              local_110._M_string_length = local_128;
              local_128 = 0;
              local_120._M_allocated_capacity._0_4_ =
                   local_120._M_allocated_capacity._0_4_ & 0xffffff00;
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              local_130 = &local_120;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,*plVar7,plVar7[1] + *plVar7);
              bVar3 = search(&local_110,&local_e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p);
              }
              if (local_130 != &local_120) {
                operator_delete(local_130);
              }
              bVar3 = !bVar3;
              pbVar9 = (pointer)CONCAT71((int7)((ulong)pbVar9 >> 8),(byte)pbVar9 & bVar3);
              bVar4 = true;
            }
            else {
              bVar3 = true;
              bVar4 = false;
            }
            unaff_RBP = (text *)((ulong)pbVar9 & 0xffffffff);
            goto LAB_0010a371;
          }
        }
        bVar3 = false;
        unaff_RBP = (text *)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      }
LAB_0010a371:
      uVar6 = (uint)unaff_RBP;
      pbVar9 = (pointer)((ulong)unaff_RBP & 0xffffffff);
    } while (bVar3);
    if (plVar2 != plVar1) goto LAB_0010a430;
    if (bVar4) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar7,plVar7[1] + *plVar7);
      bVar3 = hidden(&local_88);
      uVar6 = (uint)CONCAT71(extraout_var_00,bVar3) ^ 1;
    }
    else {
      uVar6 = 0;
    }
    _Var8._M_p = local_88._M_dataplus._M_p;
    if (!(bool)(bVar4 & (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_88._M_dataplus._M_p != &local_88.field_2)) goto LAB_0010a430;
  }
  operator_delete(_Var8._M_p);
LAB_0010a430:
  return uVar6 & 0xffffff01;
}

Assistant:

inline bool select( text name, texts include )
{
    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( texts::reverse_iterator pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        text & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}